

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::dht_tracker::incoming_error(dht_tracker *this,error_code *ec,endpoint *ep)

{
  endpoint *peVar1;
  bool bVar2;
  reference ppVar3;
  bool local_71;
  pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node> *n;
  iterator __end3;
  iterator __begin3;
  tracker_nodes_t *__range3;
  error_code local_40;
  error_code local_30;
  endpoint *local_20;
  endpoint *ep_local;
  error_code *ec_local;
  dht_tracker *this_local;
  
  local_20 = ep;
  ep_local = (endpoint *)ec;
  ec_local = (error_code *)this;
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            (&local_30,connection_refused,(type *)0x0);
  bVar2 = boost::system::operator==(ec,&local_30);
  peVar1 = ep_local;
  local_71 = true;
  if (!bVar2) {
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              (&local_40,connection_reset,(type *)0x0);
    bVar2 = boost::system::operator==((error_code *)peVar1,&local_40);
    peVar1 = ep_local;
    local_71 = true;
    if (!bVar2) {
      boost::system::error_code::error_code<boost::asio::error::basic_errors>
                ((error_code *)&__range3,connection_aborted,(type *)0x0);
      local_71 = boost::system::operator==((error_code *)peVar1,(error_code *)&__range3);
    }
  }
  if (local_71 != false) {
    __end3 = ::std::
             map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
             ::begin(&this->m_nodes);
    n = (pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>
         *)::std::
           map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
           ::end(&this->m_nodes);
    while (bVar2 = ::std::operator!=(&__end3,(_Self *)&n), bVar2) {
      ppVar3 = ::std::
               _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
               ::operator*(&__end3);
      dht::node::unreachable(&(ppVar3->second).dht,local_20);
      ::std::
      _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void dht_tracker::incoming_error(error_code const& ec, udp::endpoint const& ep)
	{
		if (ec == boost::asio::error::connection_refused
			|| ec == boost::asio::error::connection_reset
			|| ec == boost::asio::error::connection_aborted
#ifdef _WIN32
			|| ec == error_code(ERROR_HOST_UNREACHABLE, system_category())
			|| ec == error_code(ERROR_PORT_UNREACHABLE, system_category())
			|| ec == error_code(ERROR_CONNECTION_REFUSED, system_category())
			|| ec == error_code(ERROR_CONNECTION_ABORTED, system_category())
#endif
			)
		{
			for (auto& n : m_nodes)
				n.second.dht.unreachable(ep);
		}
	}